

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm_decode_mthd.c
# Opt level: O2

void decode_nvrm_mthd_context_enable_device(nvrm_mthd_context_enable_device *m)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  
  uVar1 = m->gpu_id;
  if (uVar1 == 0) {
    iVar2 = _nvrm_field_enabled("gpu_id");
    if (iVar2 == 0) goto LAB_0025a229;
    uVar1 = m->gpu_id;
  }
  fprintf(_stdout,"%sgpu_id: 0x%08x",nvrm_pfx,(ulong)uVar1);
LAB_0025a229:
  nvrm_pfx = nvrm_sep;
  for (uVar3 = 0; uVar3 != 0x20; uVar3 = uVar3 + 1) {
    if (m->unk04[uVar3] != 0) {
      fprintf(_stdout,", unk04[%d]: 0x%08x ",uVar3 & 0xffffffff);
    }
  }
  fputc(10,_stdout);
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
    return;
  }
  return;
}

Assistant:

static void decode_nvrm_mthd_context_enable_device(struct nvrm_mthd_context_enable_device *m)
{
	int j;
	nvrm_print_x32(m, gpu_id);
	for (j = 0; j < 32; ++j)
		if (m->unk04[j] != 0)
			mmt_log_cont(", unk04[%d]: 0x%08x ", j, m->unk04[j]);
	nvrm_print_ln();
}